

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiAnimation **_dest,aiAnimation *src)

{
  aiAnimation *this;
  aiAnimation *dest;
  aiAnimation *src_local;
  aiAnimation **_dest_local;
  
  if ((_dest != (aiAnimation **)0x0) && (src != (aiAnimation *)0x0)) {
    this = (aiAnimation *)operator_new(0x448);
    aiAnimation::aiAnimation(this);
    *_dest = this;
    memcpy(this,src,0x448);
    CopyPtrArray<aiNodeAnim>(&this->mChannels,src->mChannels,this->mNumChannels);
  }
  return;
}

Assistant:

void SceneCombiner::Copy( aiAnimation** _dest, const aiAnimation* src ) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiAnimation* dest = *_dest = new aiAnimation();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiAnimation));

    // and reallocate all arrays
    CopyPtrArray( dest->mChannels, src->mChannels, dest->mNumChannels );
}